

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O2

void __thiscall mir::inst::OpAccInst::display(OpAccInst *this,ostream *o)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  ostream *poVar1;
  undefined8 extraout_RDX;
  
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  std::operator<<(o," = ");
  display_op(o,this->op);
  poVar1 = std::operator<<(o," ");
  (**(this->lhs).super_Displayable._vptr_Displayable)(&this->lhs,poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  (**(this->rhs).super_Displayable._vptr_Displayable)(&this->rhs,poVar1);
  poVar1 = std::operator<<(poVar1,", ");
  UNRECOVERED_JUMPTABLE = *(this->acc).super_Displayable._vptr_Displayable;
  (*UNRECOVERED_JUMPTABLE)(&this->acc,poVar1,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void OpAccInst::display(std::ostream& o) const {
  o << dest << " = ";
  display_op(o, op);
  o << " " << lhs << ", " << rhs << ", " << acc;
}